

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cIA,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  FSpecialColormap *pFVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  BYTE BVar9;
  int iVar10;
  int iVar11;
  BYTE *pBVar12;
  long lVar13;
  int iVar14;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0058b53a_caseD_0:
    uVar7 = 0;
    uVar8 = (ulong)(uint)count;
    if (count < 1) {
      uVar8 = uVar7;
    }
    for (; (int)uVar8 != (int)uVar7; uVar7 = uVar7 + 1) {
      bVar2 = pin[1];
      if (bVar2 != 0) {
        iVar11 = (int)((uint)*pin * inf->alpha + (uint)pout[uVar7 * 4 + 2] * 0x10000) >> 0x10;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pout[uVar7 * 4 + 2] = (BYTE)iVar11;
        iVar11 = (int)((uint)*pin * inf->alpha + (uint)pout[uVar7 * 4 + 1] * 0x10000) >> 0x10;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pout[uVar7 * 4 + 1] = (BYTE)iVar11;
        iVar11 = (int)((uint)*pin * inf->alpha + (uint)pout[uVar7 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        pout[uVar7 * 4] = (BYTE)iVar11;
        pout[uVar7 * 4 + 3] = bVar2;
      }
      pin = pin + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0058b53a_caseD_0;
    case BLEND_ICEMAP:
      lVar6 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar12 = pin + 1;
      for (; count != (int)lVar6; lVar6 = lVar6 + 1) {
        BVar1 = *pBVar12;
        if (BVar1 != '\0') {
          bVar2 = pBVar12[-1] >> 4;
          iVar11 = (int)((uint)IcePalette[bVar2][0] * inf->alpha +
                        (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pout[lVar6 * 4 + 2] = (BYTE)iVar11;
          iVar11 = (int)((uint)IcePalette[bVar2][1] * inf->alpha +
                        (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pout[lVar6 * 4 + 1] = (BYTE)iVar11;
          iVar11 = (int)((uint)IcePalette[bVar2][2] * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000)
                   >> 0x10;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pout[lVar6 * 4] = (BYTE)iVar11;
          pout[lVar6 * 4 + 3] = BVar1;
        }
        pBVar12 = pBVar12 + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar6 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar12 = pin + 1;
      for (; count != (int)lVar6; lVar6 = lVar6 + 1) {
        BVar1 = *pBVar12;
        if (BVar1 != '\0') {
          iVar14 = (uint)pBVar12[-1] * inf->blendcolor[3];
          iVar11 = inf->blendcolor[1];
          iVar4 = inf->blendcolor[2];
          iVar10 = ((uint)(inf->blendcolor[0] + iVar14) >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4 + 2] * 0x10000;
          BVar9 = (BYTE)((uint)iVar10 >> 0x10);
          if (0xfe < iVar10 >> 0x10) {
            BVar9 = 0xff;
          }
          pout[lVar6 * 4 + 2] = BVar9;
          iVar11 = ((uint)(iVar11 + iVar14) >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4 + 1] * 0x10000;
          BVar9 = (BYTE)((uint)iVar11 >> 0x10);
          if (0xfe < iVar11 >> 0x10) {
            BVar9 = 0xff;
          }
          pout[lVar6 * 4 + 1] = BVar9;
          iVar11 = ((uint)(iVar14 + iVar4) >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar6 * 4] * 0x10000;
          BVar9 = (BYTE)((uint)iVar11 >> 0x10);
          if (0xfe < iVar11 >> 0x10) {
            BVar9 = 0xff;
          }
          pout[lVar6 * 4] = BVar9;
          pout[lVar6 * 4 + 3] = BVar1;
        }
        pBVar12 = pBVar12 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar6 = 0;
      if (count < 1) {
        count = 0;
      }
      pBVar12 = pin + 1;
      for (; count != (int)lVar6; lVar6 = lVar6 + 1) {
        BVar1 = *pBVar12;
        if (BVar1 != '\0') {
          bVar2 = pBVar12[-1];
          iVar11 = (int)((inf->blendcolor[0] * (uint)bVar2 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          iVar4 = inf->blendcolor[1];
          iVar10 = inf->blendcolor[2];
          pout[lVar6 * 4 + 2] = (BYTE)iVar11;
          iVar11 = (int)((iVar4 * (uint)bVar2 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pout[lVar6 * 4 + 1] = (BYTE)iVar11;
          iVar11 = (int)(((uint)bVar2 * iVar10 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          pout[lVar6 * 4] = (BYTE)iVar11;
          pout[lVar6 * 4 + 3] = BVar1;
        }
        pBVar12 = pBVar12 + step;
      }
      break;
    default:
      lVar6 = (long)inf->blend;
      if (lVar6 < 0x21) {
        if (BLEND_ICEMAP < inf->blend) {
          lVar6 = 0;
          if (count < 1) {
            count = 0;
          }
          pBVar12 = pin + 1;
          for (; count != (int)lVar6; lVar6 = lVar6 + 1) {
            BVar1 = *pBVar12;
            if (BVar1 != '\0') {
              bVar2 = pBVar12[-1];
              iVar11 = (int)(inf->alpha * (uint)bVar2 + (uint)pout[lVar6 * 4 + 2] * 0x10000) >> 0x10
              ;
              if (0xfe < iVar11) {
                iVar11 = 0xff;
              }
              pout[lVar6 * 4 + 2] = (BYTE)iVar11;
              iVar11 = (int)(inf->alpha * (uint)bVar2 + (uint)pout[lVar6 * 4 + 1] * 0x10000) >> 0x10
              ;
              if (0xfe < iVar11) {
                iVar11 = 0xff;
              }
              pout[lVar6 * 4 + 1] = (BYTE)iVar11;
              iVar11 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar6 * 4] * 0x10000) >> 0x10;
              if (0xfe < iVar11) {
                iVar11 = 0xff;
              }
              pout[lVar6 * 4] = (BYTE)iVar11;
              pout[lVar6 * 4 + 3] = BVar1;
            }
            pBVar12 = pBVar12 + step;
          }
        }
      }
      else {
        lVar13 = 0;
        if (count < 1) {
          count = 0;
        }
        pBVar12 = pin + 1;
        for (; count != (int)lVar13; lVar13 = lVar13 + 1) {
          BVar1 = *pBVar12;
          if (BVar1 != '\0') {
            uVar8 = (ulong)pBVar12[-1];
            iVar11 = (int)((uint)*(byte *)((long)pFVar5 + uVar8 * 4 + lVar6 * 0x518 + -0xa6fe) *
                           inf->alpha + (uint)pout[lVar13 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar11) {
              iVar11 = 0xff;
            }
            bVar2 = *(byte *)((long)pFVar5 + uVar8 * 4 + lVar6 * 0x518 + -0xa700);
            bVar3 = *(byte *)((long)pFVar5 + uVar8 * 4 + lVar6 * 0x518 + -0xa6ff);
            pout[lVar13 * 4 + 2] = (BYTE)iVar11;
            iVar11 = (int)((uint)bVar3 * inf->alpha + (uint)pout[lVar13 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar11) {
              iVar11 = 0xff;
            }
            pout[lVar13 * 4 + 1] = (BYTE)iVar11;
            iVar11 = (int)((uint)bVar2 * inf->alpha + (uint)pout[lVar13 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar11) {
              iVar11 = 0xff;
            }
            pout[lVar13 * 4] = (BYTE)iVar11;
            pout[lVar13 * 4 + 3] = BVar1;
          }
          pBVar12 = pBVar12 + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}